

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EntityType::CreateTokenisedString
          (KString *__return_storage_ptr__,EntityType *this,KString *Seperator)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,(ushort)this->m_ui8EntityKind);
  poVar1 = std::operator<<(poVar1,(string *)Seperator);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Domain);
  poVar1 = std::operator<<(poVar1,(string *)Seperator);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Country);
  poVar1 = std::operator<<(poVar1,(string *)Seperator);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Category);
  poVar1 = std::operator<<(poVar1,(string *)Seperator);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8SubCategory);
  poVar1 = std::operator<<(poVar1,(string *)Seperator);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Specific);
  poVar1 = std::operator<<(poVar1,(string *)Seperator);
  std::ostream::operator<<(poVar1,(ushort)this->m_ui8Extra);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EntityType::CreateTokenisedString( const KString & Seperator /*= ","*/ ) const
{
    KStringStream ss;

    ss << ( KUINT16 )m_ui8EntityKind  << Seperator
       << ( KUINT16 )m_ui8Domain      << Seperator
       << m_ui16Country               << Seperator
       << ( KUINT16 )m_ui8Category    << Seperator
       << ( KUINT16 )m_ui8SubCategory << Seperator
       << ( KUINT16 )m_ui8Specific    << Seperator
       << ( KUINT16 )m_ui8Extra;

    return ss.str();
}